

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMenuBar(void)

{
  ImVec2 IVar1;
  ImGuiWindow *clip_rect_min;
  float x2;
  float y2;
  float fVar2;
  ImRect IVar3;
  ImRect clip_rect;
  ImRect bar_rect;
  ImGuiWindow *window;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  float local_20;
  bool local_1;
  
  clip_rect_min = GetCurrentWindow();
  if ((clip_rect_min->SkipItems & 1U) == 0) {
    if ((clip_rect_min->Flags & 0x400U) == 0) {
      local_1 = false;
    }
    else {
      if ((((clip_rect_min->DC).MenuBarAppending ^ 0xffU) & 1) == 0) {
        __assert_fail("!window->DC.MenuBarAppending",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                      ,0x181f,"bool ImGui::BeginMenuBar()");
      }
      BeginGroup();
      PushID((char *)in_stack_ffffffffffffffd0);
      IVar3 = ImGuiWindow::MenuBarRect(in_stack_ffffffffffffffd0);
      local_20 = IVar3.Min.x;
      x2 = (float)(int)(local_20 + clip_rect_min->WindowBorderSize + 0.5);
      y2 = (float)(int)(IVar3.Min.y + clip_rect_min->WindowBorderSize + 0.5);
      fVar2 = ImMax<float>(clip_rect_min->WindowRounding,clip_rect_min->WindowBorderSize);
      ImMax<float>(local_20,IVar3.Max.x - fVar2);
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                     in_stack_ffffffffffffffc8,x2,y2);
      ImRect::ClipWith((ImRect *)in_stack_ffffffffffffffd0,
                       (ImRect *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      PushClipRect((ImVec2 *)clip_rect_min,(ImVec2 *)IVar3.Max,IVar3.Min.y._3_1_);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,
                     local_20 + (clip_rect_min->DC).MenuBarOffset.x,
                     IVar3.Min.y + (clip_rect_min->DC).MenuBarOffset.y);
      IVar1.y = in_stack_ffffffffffffffcc;
      IVar1.x = in_stack_ffffffffffffffc8;
      (clip_rect_min->DC).CursorPos = IVar1;
      (clip_rect_min->DC).LayoutType = 0;
      (clip_rect_min->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      (clip_rect_min->DC).NavLayerCurrentMask = 2;
      (clip_rect_min->DC).MenuBarAppending = true;
      AlignTextToFramePadding();
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;
    if (!(window->Flags & ImGuiWindowFlags_MenuBar))
        return false;

    IM_ASSERT(!window->DC.MenuBarAppending);
    BeginGroup(); // Backup position on layer 0 // FIXME: Misleading to use a group for that backup/restore
    PushID("##menubar");

    // We don't clip with current window clipping rectangle as it is already set to the area below. However we clip with window full rect.
    // We remove 1 worth of rounding to Max.x to that text in long menus and small windows don't tend to display over the lower-right rounded area, which looks particularly glitchy.
    ImRect bar_rect = window->MenuBarRect();
    ImRect clip_rect(IM_ROUND(bar_rect.Min.x + window->WindowBorderSize), IM_ROUND(bar_rect.Min.y + window->WindowBorderSize), IM_ROUND(ImMax(bar_rect.Min.x, bar_rect.Max.x - ImMax(window->WindowRounding, window->WindowBorderSize))), IM_ROUND(bar_rect.Max.y));
    clip_rect.ClipWith(window->OuterRectClipped);
    PushClipRect(clip_rect.Min, clip_rect.Max, false);

    window->DC.CursorPos = ImVec2(bar_rect.Min.x + window->DC.MenuBarOffset.x, bar_rect.Min.y + window->DC.MenuBarOffset.y);
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;
    window->DC.NavLayerCurrentMask = (1 << ImGuiNavLayer_Menu);
    window->DC.MenuBarAppending = true;
    AlignTextToFramePadding();
    return true;
}